

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satSolver.c
# Opt level: O2

int sat_solver_minimize_assumptions(sat_solver *s,int *pLits,int nLits,int nConfLimit)

{
  int iVar1;
  long lVar2;
  ulong uVar3;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  bool bVar8;
  uint local_48;
  
  lVar2 = (long)nConfLimit;
LAB_004696f5:
  do {
    if (nLits == 1) {
      if (nConfLimit != 0) {
        s->nConfLimit = lVar2 + (s->stats).conflicts;
      }
      iVar1 = sat_solver_solve_internal(s);
      return (uint)(iVar1 != -1);
    }
    if (nLits < 2) {
      __assert_fail("nLits >= 2",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satSolver.c"
                    ,0x8ab,"int sat_solver_minimize_assumptions(sat_solver *, int *, int, int)");
    }
    uVar6 = (uint)nLits >> 1;
    uVar5 = (ulong)uVar6;
    uVar7 = 0;
    while( true ) {
      if (uVar5 == uVar7) goto LAB_0046972a;
      iVar1 = sat_solver_push(s,pLits[uVar7]);
      if (iVar1 == 0) break;
      uVar7 = uVar7 + 1;
    }
    for (uVar5 = uVar7 & 0xffffffff; -1 < (int)uVar5; uVar5 = (ulong)((int)uVar5 - 1)) {
      sat_solver_pop(s);
    }
    nLits = (int)uVar7 + 1;
  } while( true );
LAB_0046972a:
  if (nConfLimit != 0) {
    s->nConfLimit = (s->stats).conflicts + lVar2;
  }
  iVar1 = sat_solver_solve_internal(s);
  uVar4 = uVar6;
  if (iVar1 == -1) {
    while (nLits = uVar6, uVar4 != 0) {
      sat_solver_pop(s);
      uVar4 = uVar4 - 1;
    }
  }
  else {
    local_48 = 1;
    if (nLits - uVar6 != 1) {
      local_48 = sat_solver_minimize_assumptions(s,pLits + uVar5,nLits - uVar6,nConfLimit);
    }
    while (uVar4 != 0) {
      sat_solver_pop(s);
      uVar4 = uVar4 - 1;
    }
    veci_resize(&s->temp_clause,0);
    for (uVar7 = 0; uVar5 != uVar7; uVar7 = uVar7 + 1) {
      veci_push(&s->temp_clause,pLits[uVar7]);
    }
    uVar7 = 0;
    if (0 < (int)local_48) {
      uVar7 = (ulong)local_48;
    }
    for (uVar3 = 0; uVar7 != uVar3; uVar3 = uVar3 + 1) {
      pLits[uVar3] = pLits[uVar5 + uVar3];
    }
    for (uVar3 = 0; uVar5 != uVar3; uVar3 = uVar3 + 1) {
      (pLits + (int)local_48)[uVar3] = (s->temp_clause).ptr[uVar3];
    }
    uVar5 = 0;
    while( true ) {
      if (uVar7 == uVar5) {
        if (nConfLimit != 0) {
          s->nConfLimit = lVar2 + (s->stats).conflicts;
        }
        iVar1 = sat_solver_solve_internal(s);
        if (iVar1 != -1) {
          if (uVar6 == 1) {
            iVar1 = 1;
          }
          else {
            iVar1 = sat_solver_minimize_assumptions(s,pLits + (int)local_48,uVar6,nConfLimit);
          }
          uVar6 = 0;
          if (0 < (int)local_48) {
            uVar6 = local_48;
          }
          while (bVar8 = uVar6 != 0, uVar6 = uVar6 - 1, bVar8) {
            sat_solver_pop(s);
          }
          return local_48 + iVar1;
        }
        uVar6 = 0;
        if (0 < (int)local_48) {
          uVar6 = local_48;
        }
        while (bVar8 = uVar6 != 0, uVar6 = uVar6 - 1, bVar8) {
          sat_solver_pop(s);
        }
        return local_48;
      }
      iVar1 = sat_solver_push(s,pLits[uVar5]);
      if (iVar1 == 0) break;
      uVar5 = uVar5 + 1;
    }
    for (uVar7 = uVar5 & 0xffffffff; -1 < (int)uVar7; uVar7 = (ulong)((int)uVar7 - 1)) {
      sat_solver_pop(s);
    }
    nLits = (int)uVar5 + 1;
  }
  goto LAB_004696f5;
}

Assistant:

int sat_solver_minimize_assumptions( sat_solver* s, int * pLits, int nLits, int nConfLimit )
{
    int i, k, nLitsL, nLitsR, nResL, nResR, status;
    if ( nLits == 1 )
    {
        // since the problem is UNSAT, we will try to solve it without assuming the last literal
        // if the result is UNSAT, the last literal can be dropped; otherwise, it is needed
        if ( nConfLimit ) s->nConfLimit = s->stats.conflicts + nConfLimit;
        status = sat_solver_solve_internal( s );
        //printf( "%c", status == l_False ? 'u' : 's' );
        return (int)(status != l_False); // return 1 if the problem is not UNSAT
    }
    assert( nLits >= 2 );
    nLitsL = nLits / 2;
    nLitsR = nLits - nLitsL;
    // assume the left lits
    for ( i = 0; i < nLitsL; i++ )
        if ( !sat_solver_push(s, pLits[i]) )
        {
            for ( k = i; k >= 0; k-- )
                sat_solver_pop(s);
            return sat_solver_minimize_assumptions( s, pLits, i+1, nConfLimit );
        }
    // solve with these assumptions
    if ( nConfLimit ) s->nConfLimit = s->stats.conflicts + nConfLimit;
    status = sat_solver_solve_internal( s );
    if ( status == l_False ) // these are enough
    {
        for ( i = 0; i < nLitsL; i++ )
            sat_solver_pop(s);
        return sat_solver_minimize_assumptions( s, pLits, nLitsL, nConfLimit );
    }
    // solve for the right lits
    nResL = nLitsR == 1 ? 1 : sat_solver_minimize_assumptions( s, pLits + nLitsL, nLitsR, nConfLimit );
    for ( i = 0; i < nLitsL; i++ )
        sat_solver_pop(s);
    // swap literals
//    assert( nResL <= nLitsL );
//    for ( i = 0; i < nResL; i++ )
//        ABC_SWAP( int, pLits[i], pLits[nLitsL+i] );
    veci_resize( &s->temp_clause, 0 );
    for ( i = 0; i < nLitsL; i++ )
        veci_push( &s->temp_clause, pLits[i] );
    for ( i = 0; i < nResL; i++ )
        pLits[i] = pLits[nLitsL+i];
    for ( i = 0; i < nLitsL; i++ )
        pLits[nResL+i] = veci_begin(&s->temp_clause)[i];
    // assume the right lits
    for ( i = 0; i < nResL; i++ )
        if ( !sat_solver_push(s, pLits[i]) )
        {
            for ( k = i; k >= 0; k-- )
                sat_solver_pop(s);
            return sat_solver_minimize_assumptions( s, pLits, i+1, nConfLimit );
        }
    // solve with these assumptions
    if ( nConfLimit ) s->nConfLimit = s->stats.conflicts + nConfLimit;
    status = sat_solver_solve_internal( s );
    if ( status == l_False ) // these are enough
    {
        for ( i = 0; i < nResL; i++ )
            sat_solver_pop(s);
        return nResL;
    }
    // solve for the left lits
    nResR = nLitsL == 1 ? 1 : sat_solver_minimize_assumptions( s, pLits + nResL, nLitsL, nConfLimit );
    for ( i = 0; i < nResL; i++ )
        sat_solver_pop(s);
    return nResL + nResR;
}